

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array.cpp
# Opt level: O0

char __thiscall Omega_h::Write<signed_char>::get(Write<signed_char> *this,LO i)

{
  char cVar1;
  ScopedTimer local_35;
  int local_34;
  ScopedTimer timer;
  Write<signed_char> *pWStack_30;
  LO i_local;
  Write<signed_char> *this_local;
  
  local_34 = i;
  pWStack_30 = this;
  ScopedTimer::ScopedTimer(&local_35,"single device to host",(char *)0x0);
  cVar1 = *(char *)((long)(this->shared_alloc_).direct_ptr + (long)local_34);
  ScopedTimer::~ScopedTimer(&local_35);
  return cVar1;
}

Assistant:

T Write<T>::get(LO i) const {
  ScopedTimer timer("single device to host");
#ifdef OMEGA_H_CHECK_BOUNDS
    OMEGA_H_CHECK(0 <= i);
    OMEGA_H_CHECK(i < size());
#endif
#ifdef OMEGA_H_USE_CUDA
  T value;
  cudaMemcpy(&value, data() + i, sizeof(T), cudaMemcpyDeviceToHost);
  return value;
#else
  return operator[](i);
#endif
}